

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StuntDouble.hpp
# Opt level: O0

RotMat3x3d * __thiscall OpenMD::StuntDouble::getA(StuntDouble *this,int snapshotNo)

{
  long *plVar1;
  long lVar2;
  undefined4 in_EDX;
  SquareMatrix3<double> *in_RSI;
  RotMat3x3d *in_RDI;
  SquareMatrix3<double> *in_stack_ffffffffffffffc8;
  
  plVar1 = (long *)(in_RSI->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1]
                   [0];
  lVar2 = (**(code **)(*plVar1 + 0x20))(plVar1,in_EDX);
  std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>::
  operator[]((vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
              *)(lVar2 + (long)(in_RSI->super_SquareMatrix<double,_3>).
                               super_RectMatrix<double,_3U,_3U>.data_[0][2] + 0x48),
             (long)*(int *)(in_RSI->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                           data_[2]);
  SquareMatrix3<double>::SquareMatrix3(in_RSI,in_stack_ffffffffffffffc8);
  return in_RDI;
}

Assistant:

RotMat3x3d getA(int snapshotNo) {
      return ((snapshotMan_->getSnapshot(snapshotNo))->*storage_)
          .aMat[localIndex_];
    }